

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::JsRTCodeParseAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ExceptionType *pSrcInfo;
  byte *script;
  DWORD_PTR sourceContext;
  DWORD_PTR sourceContext_00;
  int64 iVar1;
  ScriptContext *this;
  SourceContextInfo *pSVar2;
  JavascriptFunction *this_00;
  ParseableFunctionInfo *pfi;
  FunctionBody *body;
  ScriptContext *__localScriptContext;
  void *unaff_retaddr;
  undefined1 auStack_138 [8];
  ScriptEntryExitRecord __entryExitRecord;
  undefined1 auStack_d8 [8];
  CompileScriptException se;
  EnterScriptObject __enterScriptObject;
  Utf8SourceInfo *utf8SourceInfo;
  
  this = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (this == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind != CodeParseActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  if (((uint)evt[4].EventTimeStamp >> 6 & 1) != (uint)*(byte *)((long)&evt[1].EventTimeStamp + 4)) {
    TTDAbort_unrecoverable_error("Utf8 status is inconsistent!!!");
  }
  script = *(byte **)(evt + 2);
  iVar1 = evt[2].EventTimeStamp;
  sourceContext._0_4_ = evt[4].EventKind;
  sourceContext._4_4_ = evt[4].ResultStatus;
  pSVar2 = Js::ScriptContext::GetSourceContextInfo(this,sourceContext,(SimpleDataCacheWrapper *)0x0)
  ;
  if (pSVar2 == (SourceContextInfo *)0x0) {
    sourceContext_00._0_4_ = evt[4].EventKind;
    sourceContext_00._4_4_ = evt[4].ResultStatus;
    pSVar2 = Js::ScriptContext::CreateSourceContextInfo
                       (this,sourceContext_00,(char16 *)evt[3].EventTimeStamp,
                        (ulong)evt[3].EventKind,(SimpleDataCacheWrapper *)0x0,(char16 *)0x0,0);
  }
  pSrcInfo = &__entryExitRecord.handledExceptionType;
  Memory::Recycler::WBSetBit((char *)pSrcInfo);
  __entryExitRecord._48_8_ = pSVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pSrcInfo);
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  se.hasLineNumberInfo = false;
  se._81_7_ = 0;
  auStack_d8._0_4_ = 0;
  auStack_d8._4_4_ = 0;
  se.super_ScriptException.ichMin = 0;
  se.super_ScriptException.ichLim = 0;
  se.super_ScriptException.ei.wCode = 0;
  se.super_ScriptException.ei.wReserved = 0;
  se.super_ScriptException.ei._4_4_ = 0;
  se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
  se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
  se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
  se.super_ScriptException.ei.dwHelpContext = 0;
  se.super_ScriptException.ei._36_4_ = 0;
  se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
  se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
  se.super_ScriptException.ei.scode = 0;
  se.super_ScriptException.ei._60_4_ = 0;
  se.line._0_1_ = 0;
  this_00 = Js::ScriptContext::LoadScript
                      (this,script,(ulong)(uint)iVar1,(SRCINFO *)pSrcInfo,
                       (CompileScriptException *)auStack_d8,
                       (Utf8SourceInfo **)&__enterScriptObject.library,L"Global code",
                       (LoadScriptFlag)evt[4].EventTimeStamp,(Var)0x0);
  if (this_00 != (JavascriptFunction *)0x0) {
    pfi = Js::JavascriptFunction::GetParseableFunctionInfo(this_00);
    body = JsSupport::ForceAndGetFunctionBody(pfi);
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_138 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&se.bstrLine,this,(ScriptEntryExitRecord *)auStack_138,
               unaff_retaddr,&stack0x00000000,true,false,false);
    Js::ScriptContext::OnScriptStart(this,false,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)&se.bstrLine);
    ScriptContextTTD::ProcessFunctionBodyOnLoad(this->TTDContextInfo,body,(FunctionBody *)0x0);
    ScriptContextTTD::RegisterLoadedScript(this->TTDContextInfo,body,(uint32)evt[1].EventTimeStamp);
    ((body->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->m_sourceInfoId =
         (Type)evt[1].EventTimeStamp;
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)&se.bstrLine);
    if (this->TTDShouldPerformReplayDebuggerAction == true) {
      ExecutionInfoManager::ProcessScriptLoad
                (this->threadContext->TTDExecutionInfo,this,(uint32)evt[1].EventTimeStamp,body,
                 (Utf8SourceInfo *)__enterScriptObject.library,(CompileScriptException *)auStack_d8)
      ;
    }
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTCodeParseAction,(TTD::NSLogEvents::EventKind)67>
              (executeContext,evt,this_00);
    CompileScriptException::~CompileScriptException((CompileScriptException *)auStack_d8);
    return;
  }
  TTDAbort_unrecoverable_error("Something went wrong");
}

Assistant:

void JsRTCodeParseAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            Js::JavascriptFunction* function = nullptr;

            byte* script = cpAction->SourceCode;
            uint32 scriptByteLength = cpAction->SourceByteLength;

            TTDAssert(cpAction->IsUtf8 == ((cpAction->LoadFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source), "Utf8 status is inconsistent!!!");

            SourceContextInfo * sourceContextInfo = ctx->GetSourceContextInfo((DWORD_PTR)cpAction->SourceContextId, nullptr);

            if(sourceContextInfo == nullptr)
            {
                const char16* srcUri = cpAction->SourceUri.Contents;
                uint32 srcUriLength = cpAction->SourceUri.Length;

                sourceContextInfo = ctx->CreateSourceContextInfo((DWORD_PTR)cpAction->SourceContextId, srcUri, srcUriLength, nullptr);
            }

            TTDAssert(cpAction->IsUtf8 || sizeof(wchar) == sizeof(char16), "Non-utf8 code only allowed on windows!!!");
            const int chsize = (cpAction->LoadFlag & LoadScriptFlag_Utf8Source) ? sizeof(char) : sizeof(char16);
            SRCINFO si = {
                /* sourceContextInfo   */ sourceContextInfo,
                /* dlnHost             */ 0,
                /* ulColumnHost        */ 0,
                /* lnMinHost           */ 0,
                /* ichMinHost          */ 0,
                /* ichLimHost          */ static_cast<ULONG>(scriptByteLength / chsize), // OK to truncate since this is used to limit sourceText in debugDocument/compilation errors.
                /* ulCharOffset        */ 0,
                /* mod                 */ kmodGlobal,
                /* grfsi               */ 0
            };

            Js::Utf8SourceInfo* utf8SourceInfo = nullptr;
            CompileScriptException se;
            function = ctx->LoadScript(script, scriptByteLength, &si, &se,
                &utf8SourceInfo, Js::Constants::GlobalCode, cpAction->LoadFlag, nullptr);

            TTDAssert(function != nullptr, "Something went wrong");

            Js::FunctionBody* fb = TTD::JsSupport::ForceAndGetFunctionBody(function->GetParseableFunctionInfo());

            ////
            //We don't do this automatically in the eval helper so do it here
            BEGIN_JS_RUNTIME_CALL(ctx);
            {
                ctx->TTDContextInfo->ProcessFunctionBodyOnLoad(fb, nullptr);
                ctx->TTDContextInfo->RegisterLoadedScript(fb, cpAction->BodyCtrId);

                fb->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(cpAction->BodyCtrId);
            }
            END_JS_RUNTIME_CALL(ctx);

            if(ctx->ShouldPerformReplayDebuggerAction())
            {
                ctx->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(ctx, cpAction->BodyCtrId, fb, utf8SourceInfo, &se);
            }
            ////

            JsRTActionHandleResultForReplay<JsRTCodeParseAction, EventKind::CodeParseActionTag>(executeContext, evt, (Js::Var)function);
        }